

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O2

void __thiscall RigidBodyDynamics::Errors::RBDLError::~RBDLError(RBDLError *this)

{
  ~RBDLError(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLError : public std::exception
{
protected:
  std::string text;
public:
  RBDLError(std::string text);
  virtual const char* what() const noexcept;
}